

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O1

iterator __thiscall
prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
          (prevector<28U,_unsigned_char,_unsigned_int,_int> *this,iterator pos,uchar *value)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar6;
  uchar *__src;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = this->_size;
  uVar3 = uVar4 - 0x1d;
  iVar5 = (int)*(undefined8 *)&this->_union;
  uVar1 = (this->_union).indirect_contents.capacity;
  if (uVar4 < 0x1d) {
    uVar3 = uVar4;
    uVar1 = 0x1c;
  }
  uVar3 = uVar3 + 1;
  if (uVar1 < uVar3) {
    change_capacity(this,(uVar3 >> 1) + uVar3);
  }
  if (uVar4 < 0x1d) {
    iVar5 = (int)this;
  }
  iVar5 = (int)pos.ptr - iVar5;
  uVar4 = this->_size;
  ppVar6 = this;
  if (0x1c < uVar4) {
    ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             (this->_union).indirect_contents.indirect;
    uVar4 = uVar4 - 0x1d;
  }
  __src = (uchar *)((long)&ppVar6->_union + (long)iVar5);
  memmove((ppVar6->_union).direct + iVar5 + 1,__src,(ulong)(uVar4 - iVar5));
  this->_size = this->_size + 1;
  (ppVar6->_union).direct[iVar5] = *value;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (iterator)__src;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(iterator pos, const T& value) {
        size_type p = pos - begin();
        size_type new_size = size() + 1;
        if (capacity() < new_size) {
            change_capacity(new_size + (new_size >> 1));
        }
        T* ptr = item_ptr(p);
        T* dst = ptr + 1;
        memmove(dst, ptr, (size() - p) * sizeof(T));
        _size++;
        new(static_cast<void*>(ptr)) T(value);
        return iterator(ptr);
    }